

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_utf8.cxx
# Opt level: O0

int fl_system(char *cmd)

{
  int iVar1;
  char *cmd_local;
  
  iVar1 = system(cmd);
  return iVar1;
}

Assistant:

int fl_system(const char* cmd)
{
#if defined(WIN32) && !defined(__CYGWIN__)

# ifdef __MINGW32__
  return system(fl_utf2mbcs(cmd));
# else
  size_t l = strlen(cmd);
  unsigned wn = fl_utf8toUtf16(cmd, (unsigned) l, NULL, 0) + 1; // Query length
  wbuf = (xchar*)realloc(wbuf, sizeof(xchar)*wn);
  wn = fl_utf8toUtf16(cmd, (unsigned) l, (unsigned short *)wbuf, wn); // Convert string
  wbuf[wn] = 0;
  return _wsystem(wbuf);
# endif

#else
  return system(cmd);
#endif
}